

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-util.c
# Opt level: O1

ego_item * lookup_ego_item(char *name,wchar_t tval,wchar_t sval)

{
  bool bVar1;
  ego_item *peVar2;
  int iVar3;
  object_kind *poVar4;
  ulong uVar5;
  poss_item *ppVar6;
  ego_item *local_38;
  
  if (z_info->e_max != 0) {
    uVar5 = 0;
    do {
      peVar2 = e_info;
      bVar1 = false;
      if ((e_info[uVar5].name != (char *)0x0) &&
         (iVar3 = strcmp(name,e_info[uVar5].name), iVar3 == 0)) {
        for (ppVar6 = peVar2[uVar5].poss_items; ppVar6 != (poss_item *)0x0; ppVar6 = ppVar6->next) {
          poVar4 = lookup_kind(tval,sval);
          if (poVar4->kidx == ppVar6->kidx) {
            bVar1 = true;
            local_38 = peVar2 + uVar5;
            goto LAB_0019c334;
          }
        }
        bVar1 = false;
      }
LAB_0019c334:
      if (bVar1) {
        return local_38;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < z_info->e_max);
  }
  return (ego_item *)0x0;
}

Assistant:

struct ego_item *lookup_ego_item(const char *name, int tval, int sval)
{
	int i;

	/* Look for it */
	for (i = 0; i < z_info->e_max; i++) {
		struct ego_item *ego = &e_info[i];
		struct poss_item *poss_item = ego->poss_items;

		/* Reject nameless and wrong names */
		if (!ego->name) continue;
		if (!streq(name, ego->name)) continue;

		/* Check tval and sval */
		while (poss_item) {
			struct object_kind *kind = lookup_kind(tval, sval);
			if (kind->kidx == poss_item->kidx) {
				return ego;
			}
			poss_item = poss_item->next;
		}
	}

	return NULL;
}